

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildFile.cpp
# Opt level: O2

Command * __thiscall
anon_unknown.dwarf_10ea85::OwnershipAnalysis::includedOwnerOf
          (OwnershipAnalysis *this,StringRef inputPath)

{
  char *__s2;
  size_t __n;
  int iVar1;
  _Rb_tree_node_base *p_Var2;
  StringRef local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  p_Var2 = (this->includedPaths)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->includedPaths)._M_t._M_impl.super__Rb_tree_header) {
      return (Command *)0x0;
    }
    __s2 = *(char **)(*(long *)(p_Var2 + 1) + 8);
    __n = *(size_t *)(*(long *)(p_Var2 + 1) + 0x10);
    if ((__n == 0) || (__s2[__n - 1] != '/')) {
      local_80.Data = __s2;
      local_80.Length = __n;
      llvm::StringRef::str_abi_cxx11_(&local_50,&local_80);
      std::operator+(&local_70,&local_50,"/");
      if (local_70._M_string_length <= inputPath.Length) {
        if (local_70._M_string_length == 0) {
          std::__cxx11::string::_M_dispose();
          std::__cxx11::string::_M_dispose();
          goto LAB_0013281e;
        }
        iVar1 = bcmp(inputPath.Data,local_70._M_dataplus._M_p,local_70._M_string_length);
        std::__cxx11::string::_M_dispose();
        std::__cxx11::string::_M_dispose();
        goto joined_r0x001327f4;
      }
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    else if (__n <= inputPath.Length) {
      iVar1 = bcmp(inputPath.Data,__s2,__n);
joined_r0x001327f4:
      if (iVar1 == 0) {
LAB_0013281e:
        return (Command *)p_Var2[1]._M_parent;
      }
    }
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

Command* includedOwnerOf(StringRef inputPath) {
    auto it = std::find_if(includedPaths.begin(), includedPaths.end(), [inputPath](const std::pair<BuildNode*, Command*>& buildNodeAndCommand) -> bool {
      if (buildNodeAndCommand.first->getName().endswith("/")) {
        return inputPath.startswith(buildNodeAndCommand.first->getName());
      } else {
        return inputPath.startswith(buildNodeAndCommand.first->getName().str() + "/");
      }
    });

    if (it != includedPaths.end()) {
      return (*it).second;
    } else {
      return nullptr;
    }
  }